

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pid.c
# Opt level: O0

inform_pid_lattice * build_hasse(inform_pid_source **srcs,inform_error *err)

{
  inform_pid_source *piVar1;
  bool bVar2;
  _Bool _Var3;
  inform_pid_source **ppiVar4;
  inform_pid_source **below;
  inform_pid_source **above;
  inform_pid_source *x;
  size_t k;
  inform_pid_source *piStack_40;
  _Bool stop;
  size_t j;
  size_t i;
  inform_pid_lattice *lattice;
  size_t n;
  inform_error *err_local;
  inform_pid_source **srcs_local;
  
  if (srcs == (inform_pid_source **)0x0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_EARG;
    }
    srcs_local = (inform_pid_source **)0x0;
  }
  else {
    piVar1 = srcs[-1];
    if (piVar1 == (inform_pid_source *)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_EARG;
      }
      srcs_local = (inform_pid_source **)0x0;
    }
    else {
      srcs_local = (inform_pid_source **)inform_pid_lattice_alloc(err);
      if ((err == (inform_error *)0x0) || (*err == INFORM_SUCCESS)) {
        for (j = 0; piStack_40 = (inform_pid_source *)j, j < piVar1; j = j + 1) {
          while (piStack_40 = (inform_pid_source *)((long)&piStack_40->name + 1),
                piStack_40 < piVar1) {
            _Var3 = ::below(srcs[j],srcs[(long)piStack_40]);
            if (_Var3) {
              bVar2 = false;
              for (x = (inform_pid_source *)0x0; x < srcs[j]->above[-1];
                  x = (inform_pid_source *)((long)&x->name + 1)) {
                _Var3 = ::below(srcs[j]->above[(long)x],srcs[(long)piStack_40]);
                if (_Var3) {
                  bVar2 = true;
                  break;
                }
              }
              if (bVar2) break;
              ppiVar4 = push_source(srcs[j]->above,srcs[(long)piStack_40]);
              if (ppiVar4 == (inform_pid_source **)0x0) {
                free_all_sources(srcs);
                if (err != (inform_error *)0x0) {
                  *err = INFORM_ENOMEM;
                }
                return (inform_pid_lattice *)0x0;
              }
              srcs[j]->above = ppiVar4;
              srcs[j]->n_above = srcs[j]->n_above + 1;
              ppiVar4 = push_source(srcs[(long)piStack_40]->below,srcs[j]);
              if (ppiVar4 == (inform_pid_source **)0x0) {
                free_all_sources(srcs);
                if (err != (inform_error *)0x0) {
                  *err = INFORM_ENOMEM;
                }
                return (inform_pid_lattice *)0x0;
              }
              srcs[(long)piStack_40]->below = ppiVar4;
              srcs[(long)piStack_40]->n_below = srcs[(long)piStack_40]->n_below + 1;
            }
          }
        }
        ((inform_pid_lattice *)srcs_local)->sources = srcs;
        ((inform_pid_lattice *)srcs_local)->bottom = *srcs;
        ((inform_pid_lattice *)srcs_local)->top = srcs[(long)((long)&piVar1[-1].pi + 7)];
        ((inform_pid_lattice *)srcs_local)->size =
             (size_t)((inform_pid_lattice *)srcs_local)->sources[-1];
      }
      else {
        srcs_local = (inform_pid_source **)0x0;
      }
    }
  }
  return (inform_pid_lattice *)srcs_local;
}

Assistant:

static inform_pid_lattice *build_hasse(inform_pid_source **srcs,
        inform_error *err)
{
    if (!srcs)
    {
        INFORM_ERROR_RETURN(err, INFORM_EARG, NULL);
    }

    size_t const n = gvector_len(srcs);
    if (n == 0)
    {
        INFORM_ERROR_RETURN(err, INFORM_EARG, NULL);
    }

    inform_pid_lattice *lattice = inform_pid_lattice_alloc(err);
    if (FAILED(err))
    {
        return NULL;
    }

    for (size_t i = 0; i < n; ++i)
    {
        for (size_t j = i + 1; j < n; ++j)
        {
            if (below(srcs[i], srcs[j]))
            {
                bool stop = false;
                for (size_t k = 0; k < gvector_len(srcs[i]->above); ++k)
                {
                    inform_pid_source *x = srcs[i]->above[k];
                    if (below(x, srcs[j]))
                    {
                        stop = true;
                        break;
                    }
                }
                if (stop)
                {
                    break;
                }
                else
                {
                    inform_pid_source **above, **below;

                    above = push_source(srcs[i]->above, srcs[j]);
                    if (!above)
                    {
                        free_all_sources(srcs);
                        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
                    }
                    srcs[i]->above = above;
                    srcs[i]->n_above++;

                    below = push_source(srcs[j]->below, srcs[i]);
                    if (!below)
                    {
                        free_all_sources(srcs);
                        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
                    }
                    srcs[j]->below = below;
                    srcs[j]->n_below++;
                }
            }
        }
    }

    lattice->sources = srcs;
    lattice->bottom = srcs[0];
    lattice->top = srcs[n-1];
    lattice->size = gvector_len(lattice->sources);

    return lattice;
}